

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_enc.c
# Opt level: O1

void VP8AdjustFilterStrength(VP8EncIterator *it)

{
  double dVar1;
  int iVar2;
  VP8Encoder *pVVar3;
  double (*padVar4) [64];
  int s;
  long lVar5;
  int max_level;
  int iVar6;
  double (*padVar7) [64];
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  
  pVVar3 = it->enc_;
  padVar4 = *it->lf_stats_;
  if ((LFStats *)padVar4 == (LFStats *)0x0) {
    if (0 < pVVar3->config_->filter_strength) {
      iVar2 = (pVVar3->filter_hdr_).sharpness_;
      lVar5 = 0;
      iVar6 = 0;
      do {
        iVar8 = (int)((uint)*(ushort *)((long)pVVar3->dqm_[0].y2_.q_ + lVar5 + 2) *
                     *(int *)((long)&pVVar3->dqm_[0].max_edge_ + lVar5)) >> 3;
        if (0x3e < iVar8) {
          iVar8 = 0x3f;
        }
        if (*(int *)((long)&pVVar3->dqm_[0].fstrength_ + lVar5) <
            (int)(uint)kLevelsFromDelta[iVar2][iVar8]) {
          *(uint *)((long)&pVVar3->dqm_[0].fstrength_ + lVar5) =
               (uint)kLevelsFromDelta[iVar2][iVar8];
        }
        iVar8 = *(int *)((long)&pVVar3->dqm_[0].fstrength_ + lVar5);
        if (iVar6 <= iVar8) {
          iVar6 = iVar8;
        }
        lVar5 = lVar5 + 0x2e8;
      } while (lVar5 != 0xba0);
      (pVVar3->filter_hdr_).level_ = iVar6;
      return;
    }
  }
  else {
    lVar5 = 0;
    padVar7 = padVar4;
    do {
      dVar11 = padVar4[lVar5][0] * 1.00001;
      uVar10 = 1;
      uVar9 = 0;
      do {
        dVar1 = (*(double (*) [64])*padVar7)[uVar10];
        if (dVar11 < dVar1) {
          uVar9 = uVar10 & 0xffffffff;
          dVar11 = dVar1;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != 0x40);
      pVVar3->dqm_[lVar5].fstrength_ = (int)uVar9;
      lVar5 = lVar5 + 1;
      padVar7 = padVar7 + 1;
    } while (lVar5 != 4);
  }
  return;
}

Assistant:

void VP8AdjustFilterStrength(VP8EncIterator* const it) {
  VP8Encoder* const enc = it->enc_;
#if !defined(WEBP_REDUCE_SIZE)
  if (it->lf_stats_ != NULL) {
    int s;
    for (s = 0; s < NUM_MB_SEGMENTS; s++) {
      int i, best_level = 0;
      // Improvement over filter level 0 should be at least 1e-5 (relatively)
      double best_v = 1.00001 * (*it->lf_stats_)[s][0];
      for (i = 1; i < MAX_LF_LEVELS; i++) {
        const double v = (*it->lf_stats_)[s][i];
        if (v > best_v) {
          best_v = v;
          best_level = i;
        }
      }
      enc->dqm_[s].fstrength_ = best_level;
    }
    return;
  }
#endif  // !defined(WEBP_REDUCE_SIZE)
  if (enc->config_->filter_strength > 0) {
    int max_level = 0;
    int s;
    for (s = 0; s < NUM_MB_SEGMENTS; s++) {
      VP8SegmentInfo* const dqm = &enc->dqm_[s];
      // this '>> 3' accounts for some inverse WHT scaling
      const int delta = (dqm->max_edge_ * dqm->y2_.q_[1]) >> 3;
      const int level =
          VP8FilterStrengthFromDelta(enc->filter_hdr_.sharpness_, delta);
      if (level > dqm->fstrength_) {
        dqm->fstrength_ = level;
      }
      if (max_level < dqm->fstrength_) {
        max_level = dqm->fstrength_;
      }
    }
    enc->filter_hdr_.level_ = max_level;
  }
}